

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clocks.cc
# Opt level: O2

void __thiscall
tchecker::clock_constraints_visitor_t::add_constraints
          (clock_constraints_visitor_t *this,clock_id_t first,clock_id_t second,binary_operator_t op
          ,integer_t value)

{
  invalid_argument *this_00;
  ineq_cmp_t *__args_2;
  uint *__args_1;
  clock_id_t *__args;
  vector<tchecker::clock_constraint_t,std::allocator<tchecker::clock_constraint_t>> *this_01;
  ineq_cmp_t *__args_3;
  ineq_cmp_t local_44;
  clock_id_t local_40;
  clock_id_t local_3c;
  ineq_cmp_t local_38;
  ineq_cmp_t local_34;
  
LAB_0019b904:
  local_44 = value;
  local_40 = second;
  local_3c = first;
  switch(op) {
  case EXPR_OP_LT:
    __args = &local_3c;
    __args_1 = &local_40;
    __args_3 = &local_44;
    this_01 = (vector<tchecker::clock_constraint_t,std::allocator<tchecker::clock_constraint_t>> *)
              this->_c;
    __args_2 = &local_38;
LAB_0019b9c9:
    *__args_2 = LT;
LAB_0019b9cc:
    std::vector<tchecker::clock_constraint_t,std::allocator<tchecker::clock_constraint_t>>::
    emplace_back<unsigned_int&,unsigned_int&,tchecker::ineq_cmp_t,int&>
              (this_01,__args,__args_1,__args_2,(int *)__args_3);
    return;
  case EXPR_OP_LE:
    __args = &local_3c;
    __args_1 = &local_40;
    __args_3 = &local_44;
    this_01 = (vector<tchecker::clock_constraint_t,std::allocator<tchecker::clock_constraint_t>> *)
              this->_c;
    __args_2 = &local_38;
    break;
  case EXPR_OP_EQ:
    goto switchD_0019b917_caseD_3;
  default:
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument
              (this_00,"Unexpected expression operator in clock constraint");
    __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  case EXPR_OP_GE:
    __args_1 = &local_3c;
    __args = &local_40;
    local_38 = -value;
    __args_3 = &local_38;
    this_01 = (vector<tchecker::clock_constraint_t,std::allocator<tchecker::clock_constraint_t>> *)
              this->_c;
    __args_2 = &local_34;
    break;
  case EXPR_OP_GT:
    __args_1 = &local_3c;
    __args = &local_40;
    local_38 = -value;
    __args_3 = &local_38;
    this_01 = (vector<tchecker::clock_constraint_t,std::allocator<tchecker::clock_constraint_t>> *)
              this->_c;
    __args_2 = &local_34;
    goto LAB_0019b9c9;
  }
  *__args_2 = LE;
  goto LAB_0019b9cc;
switchD_0019b917_caseD_3:
  add_constraints(this,first,second,EXPR_OP_LE,value);
  op = EXPR_OP_GE;
  goto LAB_0019b904;
}

Assistant:

void add_constraints(tchecker::clock_id_t first, tchecker::clock_id_t second, enum tchecker::binary_operator_t op,
                       tchecker::integer_t value)
  {
    switch (op) {
    case tchecker::EXPR_OP_EQ:
      add_constraints(first, second, tchecker::EXPR_OP_LE, value);
      add_constraints(first, second, tchecker::EXPR_OP_GE, value);
      break;
    case tchecker::EXPR_OP_GE: {
      tchecker::integer_t neg_value = static_cast<tchecker::integer_t>(-value);
      _c.emplace_back(second, first, tchecker::LE, neg_value);
      break;
    }
    case tchecker::EXPR_OP_GT: {
      tchecker::integer_t neg_value = static_cast<tchecker::integer_t>(-value);
      _c.emplace_back(second, first, tchecker::LT, neg_value);
      break;
    }
    case tchecker::EXPR_OP_LE:
      _c.emplace_back(first, second, tchecker::LE, value);
      break;
    case tchecker::EXPR_OP_LT:
      _c.emplace_back(first, second, tchecker::LT, value);
      break;
    default:
      throw std::invalid_argument("Unexpected expression operator in clock constraint");
    }
  }